

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O3

void Am_Set_Animated_Slots(Am_Object *interp)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value *pAVar4;
  Am_Constraint *cause;
  Am_Object obj;
  Am_Value_List slots;
  Am_Value curr_value;
  Am_Value_List values;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Value local_58;
  Am_Value_List local_48;
  Am_Slot local_38;
  
  pAVar3 = Am_Object::Get(interp,0x169,0);
  Am_Value::Am_Value(&local_58,pAVar3);
  bVar1 = Am_Value::Exists(&local_58);
  if (bVar1) {
    Am_Object::Get_Object(&local_70,(Am_Slot_Key)interp,0x193);
    bVar1 = Am_Object::Valid(&local_70);
    if (bVar1) {
      pAVar3 = Am_Object::Get(interp,0xeb,0);
      pAVar4 = Am_Object::Get(interp,0xf6,0);
      cause = (Am_Constraint *)Am_Value::operator_cast_to_void_(pAVar4);
      bVar1 = Am_Value_List::Test(pAVar3);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_68,pAVar3);
        bVar1 = Am_Value_List::Test(&local_58);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&local_48,&local_58);
          Am_Value_List::Start(&local_48);
          Am_Value_List::Start(&local_68);
          while( true ) {
            bVar1 = Am_Value_List::Last(&local_68);
            if (bVar1) break;
            bVar1 = Am_Value_List::Last(&local_48);
            if (bVar1) break;
            pAVar3 = Am_Value_List::Get(&local_68);
            iVar2 = Am_Value::operator_cast_to_int(pAVar3);
            pAVar3 = Am_Value_List::Get(&local_48);
            if (cause == (Am_Constraint *)0x0) {
              Am_Object::Set(&local_70,(Am_Slot_Key)iVar2,pAVar3,0x90000);
            }
            else {
              local_38 = Am_Object_Advanced::Get_Slot
                                   ((Am_Object_Advanced *)&local_70,(Am_Slot_Key)iVar2);
              Am_Slot::Set(&local_38,pAVar3,cause);
              Am_Slot::Invalidate(&local_38,cause);
            }
            Am_Value_List::Next(&local_48);
            Am_Value_List::Next(&local_68);
          }
          Am_Value_List::~Am_Value_List(&local_48);
        }
        else {
          pAVar3 = Am_Value_List::Get(&local_68);
          iVar2 = Am_Value::operator_cast_to_int(pAVar3);
          if (cause == (Am_Constraint *)0x0) {
            Am_Object::Set(&local_70,(Am_Slot_Key)iVar2,&local_58,0x90000);
          }
          else {
            local_48.data =
                 (Am_Value_List_Data *)
                 Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_70,(Am_Slot_Key)iVar2);
            Am_Slot::Set((Am_Slot *)&local_48,&local_58,cause);
            Am_Slot::Invalidate((Am_Slot *)&local_48,cause);
          }
        }
        Am_Value_List::~Am_Value_List(&local_68);
      }
      else {
        bVar1 = Am_Value_List::Test(&local_58);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&local_68,&local_58);
          pAVar4 = Am_Value_List::Get(&local_68);
          Am_Value::operator=(&local_58,pAVar4);
          Am_Value_List::~Am_Value_List(&local_68);
        }
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        if (cause == (Am_Constraint *)0x0) {
          Am_Object::Set(&local_70,(Am_Slot_Key)iVar2,&local_58,0x90000);
        }
        else {
          local_68.data =
               (Am_Value_List_Data *)
               Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_70,(Am_Slot_Key)iVar2);
          Am_Slot::Set((Am_Slot *)&local_68,&local_58,cause);
          Am_Slot::Invalidate((Am_Slot *)&local_68,cause);
        }
      }
    }
    Am_Object::~Am_Object(&local_70);
  }
  Am_Value::~Am_Value(&local_58);
  return;
}

Assistant:

void
Am_Set_Animated_Slots(Am_Object interp)
{
  Am_Value curr_value = interp.Get(Am_VALUE);
  if (!curr_value.Exists())
    return;

  Am_Object obj = interp.Get_Object(Am_OPERATES_ON);
  if (!obj.Valid())
    return;

  // pass the computed value back to the animation constraint
  const Am_Value& slot_to_animate = interp.Get(Am_SLOT_TO_ANIMATE);
  Am_Constraint *constraint;

  constraint = (Am_Constraint *)(Am_Ptr)interp.Get(Am_ANIM_CONSTRAINT);

  //
  // Do we have a list of slots or just one?
  //
  if (Am_Value_List::Test(slot_to_animate)) {
    Am_Value_List slots = slot_to_animate;

    //
    // Do we have a list of values, or just one?
    //
    if (Am_Value_List::Test(curr_value)) {
      Am_Value_List values = curr_value;

      values.Start();

      //
      // Go through both lists, until one of them runs out, assigning
      // each slot the corresponding value.
      //
      for (slots.Start(); !slots.Last() && !values.Last(); slots.Next()) {
        set_animated_slot((int)slots.Get(), (Am_Object_Advanced &)obj,
                          constraint, values.Get());
        values.Next();
      }
    } else {
      //
      // We've only got a single value, so assign it just to the
      // first slot.
      //
      set_animated_slot((int)slots.Get(), (Am_Object_Advanced &)obj, constraint,
                        curr_value);
    }
  }
  //
  // We come here if we only have a single slot.
  //
  else {
    //
    // If `curr_value' is really a list, then get its first value.
    //
    if (Am_Value_List::Test(curr_value))
      curr_value = ((Am_Value_List)curr_value).Get();

    //
    // We have just one slot so assign it the value.
    //
    set_animated_slot((int)slot_to_animate, (Am_Object_Advanced &)obj,
                      constraint, curr_value);
  }
}